

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ExprCheckIN(Parse *pParse,Expr *pIn)

{
  Expr *pExpr;
  u8 uVar1;
  int iVar2;
  Select *pSVar3;
  
  pExpr = pIn->pLeft;
  uVar1 = pExpr->op;
  if (uVar1 == 0x9d) {
    uVar1 = pExpr->op2;
  }
  if (uVar1 == 'w') {
    pSVar3 = (pExpr->x).pSelect;
  }
  else {
    iVar2 = 1;
    if (uVar1 != 0x9e) goto LAB_002383ae;
    pSVar3 = (Select *)&pExpr->x;
  }
  iVar2 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar3->pEList)->pList->nExpr;
LAB_002383ae:
  if ((pIn->flags & 0x800) == 0) {
    if (iVar2 == 1) {
      return 0;
    }
    sqlite3VectorErrorMsg(pParse,pExpr);
  }
  else {
    if (iVar2 == ((pIn->x).pSelect)->pEList->nExpr) {
      return 0;
    }
    sqlite3ErrorMsg(pParse,"sub-select returns %d columns - expected %d");
  }
  return 1;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCheckIN(Parse *pParse, Expr *pIn){
  int nVector = sqlite3ExprVectorSize(pIn->pLeft);
  if( (pIn->flags & EP_xIsSelect) ){
    if( nVector!=pIn->x.pSelect->pEList->nExpr ){
      sqlite3SubselectError(pParse, pIn->x.pSelect->pEList->nExpr, nVector);
      return 1;
    }
  }else if( nVector!=1 ){
    sqlite3VectorErrorMsg(pParse, pIn->pLeft);
    return 1;
  }
  return 0;
}